

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

float __thiscall
tcu::ConstPixelBufferAccess::getPixDepth(ConstPixelBufferAccess *this,int x,int y,int z)

{
  undefined1 uVar1;
  undefined2 uVar2;
  ChannelType CVar3;
  uint uVar4;
  double *pdVar5;
  float fVar6;
  float fVar7;
  
  pdVar5 = (double *)
           ((long)this->m_data +
           (long)(z * (this->m_pitch).m_data[2]) + (long)(y * (this->m_pitch).m_data[1]) +
           (long)(x * (this->m_pitch).m_data[0]));
  CVar3 = (this->m_format).type;
  if ((int)CVar3 < 0x1a) {
    if (CVar3 == UNSIGNED_INT_16_8_8) {
      return (float)*(ushort *)((long)pdVar5 + 2) / 65535.0;
    }
    if (CVar3 == UNSIGNED_INT_24_8) {
      uVar2 = *(undefined2 *)((long)pdVar5 + 1);
      uVar1 = *(undefined1 *)((long)pdVar5 + 3);
LAB_019e8d0f:
      return (float)CONCAT12(uVar1,uVar2) / 16777215.0;
    }
  }
  else {
    if (CVar3 == UNSIGNED_INT_24_8_REV) {
      uVar2 = *(undefined2 *)pdVar5;
      uVar1 = *(undefined1 *)((long)pdVar5 + 2);
      goto LAB_019e8d0f;
    }
    if (CVar3 == FLOAT_UNSIGNED_INT_24_8_REV) {
      return *(float *)pdVar5;
    }
  }
  switch(CVar3) {
  case SNORM_INT8:
    fVar7 = (float)(int)*(char *)pdVar5 / 127.0;
    goto LAB_019e88dd;
  case SNORM_INT16:
    fVar7 = (float)(int)*(short *)pdVar5 / 32767.0;
    goto LAB_019e88dd;
  case SNORM_INT32:
    fVar7 = (float)*(int *)pdVar5 * 4.656613e-10;
LAB_019e88dd:
    fVar6 = -1.0;
    if (-1.0 <= fVar7) {
      fVar6 = fVar7;
    }
    return fVar6;
  case UNORM_INT8:
    return (float)*(byte *)pdVar5 / 255.0;
  case UNORM_INT16:
    return (float)*(ushort *)pdVar5 / 65535.0;
  case UNORM_INT24:
    return (float)*(uint3 *)pdVar5 / 16777215.0;
  case UNORM_INT32:
    return (float)*(uint *)pdVar5 * 2.3283064e-10;
  default:
    return 0.0;
  case SIGNED_INT8:
    uVar4 = (uint)*(char *)pdVar5;
    break;
  case SIGNED_INT16:
    uVar4 = (uint)*(short *)pdVar5;
    break;
  case SIGNED_INT32:
    return (float)*(int *)pdVar5;
  case UNSIGNED_INT8:
    uVar4 = (uint)*(byte *)pdVar5;
    break;
  case UNSIGNED_INT16:
    uVar4 = (uint)*(ushort *)pdVar5;
    break;
  case UNSIGNED_INT24:
    return (float)*(uint3 *)pdVar5;
  case UNSIGNED_INT32:
    return (float)*(uint *)pdVar5;
  case HALF_FLOAT:
    fVar7 = deFloat16To32(*(deFloat16 *)pdVar5);
    return fVar7;
  case FLOAT:
    return *(float *)pdVar5;
  case FLOAT64:
    return (float)*pdVar5;
  }
  return (float)(int)uVar4;
}

Assistant:

float ConstPixelBufferAccess::getPixDepth (int x, int y, int z) const
{
	DE_ASSERT(de::inBounds(x, 0, getWidth()));
	DE_ASSERT(de::inBounds(y, 0, getHeight()));
	DE_ASSERT(de::inBounds(z, 0, getDepth()));

	const deUint8* const pixelPtr = (const deUint8*)getPixelPtr(x, y, z);

	switch (m_format.type)
	{
		case TextureFormat::UNSIGNED_INT_16_8_8:
			DE_ASSERT(m_format.order == TextureFormat::DS);
			return (float)readUint32High16(pixelPtr) / 65535.0f;

		case TextureFormat::UNSIGNED_INT_24_8:
			DE_ASSERT(m_format.order == TextureFormat::D || m_format.order == TextureFormat::DS);
			return (float)readUint32High24(pixelPtr) / 16777215.0f;

		case TextureFormat::UNSIGNED_INT_24_8_REV:
			DE_ASSERT(m_format.order == TextureFormat::D || m_format.order == TextureFormat::DS);
			return (float)readUint32Low24(pixelPtr) / 16777215.0f;

		case TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV:
			DE_ASSERT(m_format.order == TextureFormat::DS);
			return *((const float*)pixelPtr);

		default:
			DE_ASSERT(m_format.order == TextureFormat::D); // no other combined depth stencil types
			return channelToFloat(pixelPtr, m_format.type);
	}
}